

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O2

bool __thiscall senjo::GoCommandHandle::Parse(GoCommandHandle *this,char *params)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Output *this_00;
  bool invalid;
  Output local_a0 [4];
  char *params_local;
  uint64_t *local_78;
  int *local_70;
  int *local_68;
  Output local_60;
  uint64_t *local_58;
  uint64_t *local_50;
  uint64_t *local_48;
  uint64_t *local_40;
  uint64_t *local_38;
  
  params_local = params;
  if ((Parse(char_const*)::argBinc_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argBinc_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argBinc_abi_cxx11_,"binc",(allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argBinc_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argBinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argBtime_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argBtime_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argBtime_abi_cxx11_,"btime",(allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argBtime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argBtime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argDepth_abi_cxx11_,"depth",(allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argDepth_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argInfinite_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argInfinite_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argInfinite_abi_cxx11_,"infinite",
               (allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argInfinite_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argInfinite_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovestogo_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argMovestogo_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argMovestogo_abi_cxx11_,"movestogo",
               (allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argMovestogo_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovestogo_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovetime_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argMovetime_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argMovetime_abi_cxx11_,"movetime",
               (allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argMovetime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovetime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNodes_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argNodes_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argNodes_abi_cxx11_,"nodes",(allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argNodes_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argNodes_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPonder_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argPonder_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argPonder_abi_cxx11_,"ponder",(allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argPonder_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argPonder_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSearchmoves_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argSearchmoves_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argSearchmoves_abi_cxx11_,"searchmoves",
               (allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argSearchmoves_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argSearchmoves_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWinc_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argWinc_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argWinc_abi_cxx11_,"winc",(allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argWinc_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argWinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWtime_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argWtime_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argWtime_abi_cxx11_,"wtime",(allocator *)local_a0);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argWtime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argWtime_abi_cxx11_);
  }
  this->infinite = false;
  this->ponder = false;
  this->depth = 0;
  this->movestogo = 0;
  local_68 = &this->depth;
  local_70 = &this->movestogo;
  local_78 = &this->binc;
  local_38 = &this->btime;
  local_40 = &this->movetime;
  local_48 = &this->nodes;
  local_50 = &this->winc;
  local_58 = &this->wtime;
  this->binc = 0;
  this->btime = 0;
  this->movetime = 0;
  this->nodes = 0;
  this->winc = 0;
  this->wtime = 0;
  invalid = false;
  do {
    if (((invalid & 1U) != 0) || (params_local == (char *)0x0)) {
      if ((invalid & 1U) == 0) {
LAB_0013a728:
        if ((this->infinite == false) && (this->ponder != true)) {
          return true;
        }
        *local_68 = 0;
        *local_70 = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        *local_78 = 0;
        local_78[1] = 0;
        return true;
      }
      Output::Output(&local_60,InfoPrefix);
      std::operator<<((ostream *)&std::cout,"usage: ");
      (*(this->super_BackgroundCommand)._vptr_BackgroundCommand[3])(local_a0,this);
      std::operator<<((ostream *)&std::cout,(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      this_00 = &local_60;
      goto LAB_0013a6f5;
    }
    pcVar3 = NextWord(&params_local);
    if (*pcVar3 == '\0') goto LAB_0013a728;
    bVar1 = ParamMatch(&Parse(char_const*)::argSearchmoves_abi_cxx11_,&params_local);
    if (bVar1) {
      Output::Output(local_a0,InfoPrefix);
      std::operator<<((ostream *)&std::cout,"searchmoves not implemented!");
      Output::~Output(local_a0);
      goto LAB_0013a728;
    }
    bVar1 = HasParam(&Parse(char_const*)::argInfinite_abi_cxx11_,&this->infinite,&params_local);
  } while ((((((bVar1) ||
              (bVar1 = HasParam(&Parse(char_const*)::argPonder_abi_cxx11_,&this->ponder,
                                &params_local), bVar1)) ||
             (bVar1 = NumberParam<int>(&Parse(char_const*)::argDepth_abi_cxx11_,local_68,
                                       &params_local,&invalid), bVar1)) ||
            ((bVar1 = NumberParam<int>(&Parse(char_const*)::argMovestogo_abi_cxx11_,local_70,
                                       &params_local,&invalid), bVar1 ||
             (bVar1 = NumberParam<unsigned_long>
                                (&Parse(char_const*)::argBinc_abi_cxx11_,local_78,&params_local,
                                 &invalid), bVar1)))) ||
           ((bVar1 = NumberParam<unsigned_long>
                               (&Parse(char_const*)::argBtime_abi_cxx11_,local_38,&params_local,
                                &invalid), bVar1 ||
            ((bVar1 = NumberParam<unsigned_long>
                                (&Parse(char_const*)::argMovetime_abi_cxx11_,local_40,&params_local,
                                 &invalid), bVar1 ||
             (bVar1 = NumberParam<unsigned_long>
                                (&Parse(char_const*)::argNodes_abi_cxx11_,local_48,&params_local,
                                 &invalid), bVar1)))))) ||
          ((bVar1 = NumberParam<unsigned_long>
                              (&Parse(char_const*)::argWinc_abi_cxx11_,local_50,&params_local,
                               &invalid), bVar1 ||
           (bVar1 = NumberParam<unsigned_long>
                              (&Parse(char_const*)::argWtime_abi_cxx11_,local_58,&params_local,
                               &invalid), bVar1))));
  Output::Output(local_a0,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"Unexpected token: ");
  std::operator<<((ostream *)&std::cout,params_local);
  this_00 = local_a0;
LAB_0013a6f5:
  Output::~Output(this_00);
  return false;
}

Assistant:

bool GoCommandHandle::Parse(const char* params)
{
  static const std::string argBinc        = "binc";
  static const std::string argBtime       = "btime";
  static const std::string argDepth       = "depth";
  static const std::string argInfinite    = "infinite";
  static const std::string argMovestogo   = "movestogo";
  static const std::string argMovetime    = "movetime";
  static const std::string argNodes       = "nodes";
  static const std::string argPonder      = "ponder";
  static const std::string argSearchmoves = "searchmoves";
  static const std::string argWinc        = "winc";
  static const std::string argWtime       = "wtime";

  infinite  = false;
  ponder    = false;
  depth     = 0;
  movestogo = 0;
  binc      = 0;
  btime     = 0;
  movetime  = 0;
  nodes     = 0;
  winc      = 0;
  wtime     = 0;

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (ParamMatch(argSearchmoves, params)) {
      Output() << "searchmoves not implemented!"; // TODO
      break;
    }
    if (HasParam(argInfinite,     infinite,  params) ||
        HasParam(argPonder,       ponder,    params) ||
        NumberParam(argDepth,     depth,     params, invalid) ||
        NumberParam(argMovestogo, movestogo, params, invalid) ||
        NumberParam(argBinc,      binc,      params, invalid) ||
        NumberParam(argBtime,     btime,     params, invalid) ||
        NumberParam(argMovetime,  movetime,  params, invalid) ||
        NumberParam(argNodes,     nodes,     params, invalid) ||
        NumberParam(argWinc,      winc,      params, invalid) ||
        NumberParam(argWtime,     wtime,     params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (infinite || ponder) {
    depth     = 0;
    movestogo = 0;
    binc      = 0;
    btime     = 0;
    movetime  = 0;
    nodes     = 0;
    winc      = 0;
    wtime     = 0;
  }

  return true;
}